

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O0

void burstsortA(string *strings,size_t scnt)

{
  TRIE_conflict *root_00;
  TRIE_conflict *root;
  size_t scnt_local;
  string *strings_local;
  
  root_00 = (TRIE_conflict *)calloc(1,0xd08);
  burstinsertA(root_00,strings,(int)scnt);
  bursttraverseA(root_00,strings,0,0);
  return;
}

Assistant:

void
burstsortA(string strings[], size_t scnt)
{
    TRIE	*root;

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertA(root, strings, scnt);
    (void) bursttraverseA(root, strings, 0, 0);

    return;
}